

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::Plain
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,idx_t num_values,
          idx_t result_offset,Vector *result)

{
  NotImplementedException *this_00;
  allocator local_39;
  string local_38 [32];
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"Plain not implemented",&local_39);
  duckdb::NotImplementedException::NotImplementedException(this_00,local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColumnReader::Plain(ByteBuffer &plain_data, uint8_t *defines, idx_t num_values, // NOLINT
                         idx_t result_offset, Vector &result) {
	throw NotImplementedException("Plain not implemented");
}